

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O3

int WebRtcNs_InitCore(NoiseSuppressionC *self,uint32_t fs)

{
  long lVar1;
  size_t sVar2;
  float *pfVar3;
  int iVar4;
  ulong n;
  bool bVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  long lVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fStack_64;
  
  iVar4 = -1;
  if ((self != (NoiseSuppressionC *)0x0) && ((fs == 16000 || (fs == 8000)))) {
    bVar5 = fs != 8000;
    self->fs = fs;
    self->windShift = 0;
    sVar2 = 0xa0;
    if (!bVar5) {
      sVar2 = 0x50;
    }
    pfVar3 = kBlocks160w256;
    if (!bVar5) {
      pfVar3 = kBlocks80w128;
    }
    n = (ulong)bVar5 * 0x80 + 0x80;
    self->blockLen = sVar2;
    self->anaLen = n;
    sVar2 = (n >> 1) + 1;
    self->window = pfVar3;
    self->magnLen = sVar2;
    self->normMagnLen = 1.0 / (float)(int)sVar2;
    self->ip[0] = 0;
    memset(self->dataBuf,0,0x400);
    WebRtc_rdft(n,1,self->dataBuf,self->ip,self->wfft);
    memset(self->dataBufHB,0,0x800);
    memset(self->quantile,0,0x204);
    memset(self->analyzeBuf,0,0xc00);
    lVar1 = -0x183;
    do {
      self->quantile[lVar1] = 8.0;
      self->lquantile[lVar1] = 0.3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
    lVar1 = 0;
    auVar12 = _DAT_00139810;
    do {
      auVar8 = auVar12 ^ _DAT_00135060;
      lVar10 = auVar12._8_8_;
      auVar9._0_4_ = (float)((double)((auVar12._0_8_ + 1U & 0xffffffff) * 200 & 0xffffffff |
                                     0x4330000000000000) - 4503599627370496.0);
      auVar9._4_4_ = (float)((double)((lVar10 + 1U & 0xffffffff) * 200 & 0xffffffff |
                                     0x4330000000000000) - 4503599627370496.0);
      auVar9._8_8_ = 0;
      auVar9 = divps(auVar9,_DAT_00139e20);
      fVar6 = floorf(auVar9._0_4_);
      fStack_64 = auVar9._4_4_;
      fVar7 = floorf(fStack_64);
      if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffffd) {
        self->counter[lVar1] = (int)fVar6;
        self->counter[lVar1 + 1] = (int)fVar7;
      }
      lVar1 = lVar1 + 2;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar10 + 2;
    } while (lVar1 != 4);
    self->updates = 0;
    lVar1 = 0;
    do {
      self->smooth[lVar1] = 1.0;
      fVar6 = logf((float)(int)lVar1);
      self->log_lut[lVar1] = fVar6;
      self->log_lut_sqr[lVar1] = fVar6 * fVar6;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x81);
    self->priorSpeechProb = 0.5;
    lVar1 = 0;
    memset(self->magnAvgPause,0,0x204);
    memset(self->speechProb,0,0x204);
    memset(self->initMagnEst,0,0x204);
    memset(self->noise,0,0x810);
    auVar12 = _DAT_00135060;
    auVar8 = _DAT_00139e30;
    auVar11 = _DAT_00139810;
    do {
      auVar9 = auVar11 ^ auVar12;
      if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffff7f) {
        self->logLrtTimeAvg[lVar1] = 0.5;
        self->logLrtTimeAvg[lVar1 + 1] = 0.5;
      }
      auVar9 = auVar8 ^ auVar12;
      if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffff7f) {
        self->logLrtTimeAvg[lVar1 + 2] = 0.5;
        self->logLrtTimeAvg[lVar1 + 3] = 0.5;
      }
      lVar1 = lVar1 + 4;
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar10 + 4;
    } while (lVar1 != 0x84);
    self->featureData[0] = 0.5;
    self->featureData[1] = 0.0;
    self->featureData[2] = 0.0;
    self->featureData[3] = 0.5;
    self->featureData[4] = 0.5;
    self->featureData[5] = 0.0;
    iVar4 = 0;
    self->featureData[6] = 0.0;
    memset(self->histLrt,0,12000);
    self->priorModelPars[0] = 0.5;
    self->priorModelPars[1] = 0.5;
    self->priorModelPars[2] = 1.0;
    self->priorModelPars[3] = 0.5;
    self->priorModelPars[4] = 1.0;
    self->priorModelPars[5] = 0.0;
    self->priorModelPars[6] = 0.0;
    self->blockInd = -1;
    self->modelUpdatePars[0] = 2;
    self->modelUpdatePars[1] = 500;
    self->modelUpdatePars[2] = 0;
    self->modelUpdatePars[3] = 500;
    self->signalEnergy = 0.0;
    self->sumMagn = 0.0;
    self->whiteNoiseLevel = 0.0;
    self->pinkNoiseNumerator = 0.0;
    self->pinkNoiseExp = 0.0;
    (self->featureExtractionParams).binSizeLrt = 0.1;
    (self->featureExtractionParams).binSizeSpecFlat = 0.05;
    (self->featureExtractionParams).binSizeSpecDiff = 0.1;
    (self->featureExtractionParams).rangeAvgHistLrt = 1.0;
    (self->featureExtractionParams).factor1ModelPars = 1.2;
    (self->featureExtractionParams).factor2ModelPars = 0.9;
    (self->featureExtractionParams).thresPosSpecFlat = 0.6;
    (self->featureExtractionParams).limitPeakSpacingSpecFlat = 0.1;
    (self->featureExtractionParams).limitPeakSpacingSpecDiff = 0.2;
    (self->featureExtractionParams).limitPeakWeightsSpecFlat = 0.5;
    (self->featureExtractionParams).limitPeakWeightsSpecDiff = 0.5;
    (self->featureExtractionParams).thresFluctLrt = 0.05;
    (self->featureExtractionParams).maxLrt = 1.0;
    (self->featureExtractionParams).minLrt = 0.2;
    (self->featureExtractionParams).maxSpecFlat = 0.95;
    (self->featureExtractionParams).minSpecFlat = 0.1;
    (self->featureExtractionParams).maxSpecDiff = 1.0;
    (self->featureExtractionParams).minSpecDiff = 0.16;
    (self->featureExtractionParams).thresWeightSpecFlat = 0x96;
    (self->featureExtractionParams).thresWeightSpecDiff = 0x96;
    self->overdrive = 1.0;
    self->denoiseBound = 0.5;
    self->gainmap = 0;
    self->aggrMode = 0;
    self->initFlag = 1;
  }
  return iVar4;
}

Assistant:

int WebRtcNs_InitCore(NoiseSuppressionC *self, uint32_t fs) {
    int i;
    // Check for valid pointer.
    if (self == NULL) {
        return -1;
    }
    // Initialization of struct.
    if (fs == 8000 || fs == 16000) {
        self->fs = fs;
    } else {
        return -1;
    }
    self->windShift = 0;
    // We only support 10ms frames.
    if (fs == 8000) {
        self->blockLen = 80;
        self->anaLen = 128;
        self->window = kBlocks80w128;
    } else {
        self->blockLen = 160;
        self->anaLen = 256;
        self->window = kBlocks160w256;
    }
    self->magnLen = self->anaLen / 2 + 1;  // Number of frequency bins.
    self->normMagnLen = 1.0f / self->magnLen;
    // Initialize FFT work arrays.
    self->ip[0] = 0;  // Setting this triggers initialization.
    memset(self->dataBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    WebRtc_rdft(self->anaLen, 1, self->dataBuf, self->ip, self->wfft);

    memset(self->analyzeBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    memset(self->dataBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    memset(self->syntBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);

    // For HB processing.
    memset(self->dataBufHB, 0, sizeof(float) * NUM_HIGH_BANDS_MAX * ANAL_BLOCKL_MAX);

    // For quantile noise estimation.
    memset(self->quantile, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    for (i = 0; i < SIMULT * HALF_ANAL_BLOCKL; i++) {
        self->lquantile[i] = 8.f;
        self->density[i] = 0.3f;
    }

    for (i = 0; i < SIMULT; i++) {
        self->counter[i] = (int) floorf((float) (END_STARTUP_LONG * (i + 1)) / (float) SIMULT);
    }

    self->updates = 0;

    // Wiener filter initialization.
    for (i = 0; i < HALF_ANAL_BLOCKL; i++) {
        self->smooth[i] = 1.f;
        self->log_lut[i] = logf((float) i);
        self->log_lut_sqr[i] = self->log_lut[i] * self->log_lut[i];
    }

    // Set the aggressiveness: default.
    self->aggrMode = 0;

    // Initialize variables for new method.
    self->priorSpeechProb = 0.5f;  // Prior prob for speech/noise.
    // Previous analyze mag spectrum.
    memset(self->magnPrevAnalyze, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Previous process mag spectrum.
    memset(self->magnPrevProcess, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Current noise-spectrum.
    memset(self->noise, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Previous noise-spectrum.
    memset(self->noisePrev, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Conservative noise spectrum estimate.
    memset(self->magnAvgPause, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // For estimation of HB in second pass.
    memset(self->speechProb, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Initial average magnitude spectrum.
    memset(self->initMagnEst, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    for (i = 0; i < HALF_ANAL_BLOCKL; i++) {
        // Smooth LR (same as threshold).
        self->logLrtTimeAvg[i] = LRT_FEATURE_THR;
    }

    // Feature quantities.
    // Spectral flatness (start on threshold).
    self->featureData[0] = SF_FEATURE_THR;
    self->featureData[1] = 0.f;  // Spectral entropy: not used in this version.
    self->featureData[2] = 0.f;  // Spectral variance: not used in this version.
    // Average LRT factor (start on threshold).
    self->featureData[3] = LRT_FEATURE_THR;
    // Spectral template diff (start on threshold).
    self->featureData[4] = SF_FEATURE_THR;
    self->featureData[5] = 0.f;  // Normalization for spectral difference.
    // Window time-average of input magnitude spectrum.
    self->featureData[6] = 0.f;

    // Histogram quantities: used to estimate/update thresholds for features.
    memset(self->histLrt, 0, sizeof(int) * HIST_PAR_EST);
    memset(self->histSpecFlat, 0, sizeof(int) * HIST_PAR_EST);
    memset(self->histSpecDiff, 0, sizeof(int) * HIST_PAR_EST);


    self->blockInd = -1;  // Frame counter.
    // Default threshold for LRT feature.
    self->priorModelPars[0] = LRT_FEATURE_THR;
    // Threshold for spectral flatness: determined on-line.
    self->priorModelPars[1] = 0.5f;
    // sgn_map par for spectral measure: 1 for flatness measure.
    self->priorModelPars[2] = 1.f;
    // Threshold for template-difference feature: determined on-line.
    self->priorModelPars[3] = 0.5f;
    // Default weighting parameter for LRT feature.
    self->priorModelPars[4] = 1.f;
    // Default weighting parameter for spectral flatness feature.
    self->priorModelPars[5] = 0.f;
    // Default weighting parameter for spectral difference feature.
    self->priorModelPars[6] = 0.f;

    // Update flag for parameters:
    // 0 no update, 1 = update once, 2 = update every window.
    self->modelUpdatePars[0] = 2;
    self->modelUpdatePars[1] = 500;  // Window for update.
    // Counter for update of conservative noise spectrum.
    self->modelUpdatePars[2] = 0;
    // Counter if the feature thresholds are updated during the sequence.
    self->modelUpdatePars[3] = self->modelUpdatePars[1];

    self->signalEnergy = 0.0;
    self->sumMagn = 0.0;
    self->whiteNoiseLevel = 0.0;
    self->pinkNoiseNumerator = 0.0;
    self->pinkNoiseExp = 0.0;

    set_feature_extraction_parameters(self);

    // Default mode.
    WebRtcNs_set_policy_core(self, 0);

    self->initFlag = 1;
    return 0;
}